

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O1

void __thiscall
cfd::core::Address::CalculateP2SH(Address *this,ByteData160 *hash_data,uint8_t prefix)

{
  char *pcVar1;
  int iVar2;
  NetType_conflict NVar3;
  CfdException *this_00;
  undefined7 in_register_00000011;
  char *wally_string;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes;
  uint8_t addr_prefix;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> address_data;
  char *output;
  uint8_t local_7d;
  int local_7c;
  undefined1 local_78 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  WallyUtil *local_40;
  CfdSourceLocation local_38;
  
  ByteData160::GetBytes(&local_58,hash_data);
  local_7d = prefix;
  if (((int)CONCAT71(in_register_00000011,prefix) == 0) && ((ulong)(uint)this->type_ < 3)) {
    local_7d = AddressFormatData::GetP2shPrefix
                         ((AddressFormatData *)
                          ((ulong)(uint)this->type_ * 0x30 + kBitcoinAddressFormatList));
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&this->format_data_,
                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)((ulong)(uint)this->type_ * 0x30 + kBitcoinAddressFormatList));
    NVar3 = AddressFormatData::GetNetType(&this->format_data_);
    this->type_ = NVar3;
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,
             (const_iterator)
             local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,&local_7d);
  local_40 = (WallyUtil *)0x0;
  local_7c = wally_base58_from_bytes
                       (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,1,(char **)&local_40);
  if (local_7c == 0) {
    WallyUtil::ConvertStringAndFree_abi_cxx11_((string *)local_78,local_40,wally_string);
    ::std::__cxx11::string::operator=((string *)&this->address_,(string *)local_78);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_);
    }
    if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  local_78._0_8_ = "cfdcore_address.cpp";
  local_78._8_4_ = 0x348;
  local_78._16_8_ = "CalculateP2SH";
  logger::log<int&>((CfdSourceLocation *)local_78,kCfdLogLevelWarning,
                    "wally_base58_from_bytes error. ret={}.",&local_7c);
  local_38.filename = "cfdcore_address.cpp";
  local_38.line = 0x34a;
  local_38.funcname = "CalculateP2SH";
  StringUtil::ByteToString_abi_cxx11_((string *)local_78,(StringUtil *)&local_58,bytes);
  logger::log<std::__cxx11::string&>
            (&local_38,kCfdLogLevelInfo,"input hash={}",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  pcVar1 = local_78 + 0x10;
  if ((char *)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_);
  }
  iVar2 = local_7c;
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_78._0_8_ = pcVar1;
  if (iVar2 == -2) {
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Base58 encode error.","");
    CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_78);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Base58 encode error.","");
  CfdException::CfdException(this_00,kCfdInternalError,(string *)local_78);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Address::CalculateP2SH(const ByteData160& hash_data, uint8_t prefix) {
  std::vector<uint8_t> address_data = hash_data.GetBytes();

  // Add first to the list the Address Prefix
  uint8_t addr_prefix = prefix;
  if ((addr_prefix == 0) && (kMainnet <= type_) && (type_ <= kRegtest)) {
    addr_prefix = kBitcoinAddressFormatList[type_].GetP2shPrefix();
    format_data_ = kBitcoinAddressFormatList[type_];
    SetNetType(format_data_);
  }
  address_data.insert(address_data.begin(), addr_prefix);

  char* output = NULL;
  uint32_t flags = BASE58_FLAG_CHECKSUM;
  int ret = wally_base58_from_bytes(
      address_data.data(), address_data.size(), flags, &output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_base58_from_bytes error. ret={}.", ret);
    info(
        CFD_LOG_SOURCE, "input hash={}",
        StringUtil::ByteToString(address_data));
    if (ret == WALLY_EINVAL) {
      throw CfdException(kCfdIllegalArgumentError, "Base58 encode error.");
    } else {
      throw CfdException(kCfdInternalError, "Base58 encode error.");
    }
  }

  address_ = WallyUtil::ConvertStringAndFree(output);
}